

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

Vec_Int_t * Abc_ManReadBinary(char *pFileName,char *pToken)

{
  byte *pbVar1;
  char cVar2;
  Vec_Str_t *p;
  char *pcVar3;
  size_t sVar4;
  Vec_Int_t *p_00;
  int Entry;
  ulong uVar5;
  ulong uVar6;
  
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
  }
  else {
    pcVar3 = strstr(p->pArray,pToken);
    uVar6 = 0;
    if (pcVar3 == (char *)0x0) {
      p_00 = (Vec_Int_t *)0x0;
    }
    else {
      sVar4 = strlen(pToken);
      pcVar3 = pcVar3 + sVar4;
      p_00 = Vec_IntAlloc(100);
      sVar4 = strlen(pcVar3);
      uVar5 = sVar4 & 0xffffffff;
      if ((int)sVar4 < 1) {
        uVar5 = uVar6;
      }
      do {
        if (uVar5 == uVar6) break;
        cVar2 = pcVar3[uVar6];
        Entry = 0;
        if ((cVar2 == '0') || (cVar2 == '?')) {
LAB_0028857f:
          Vec_IntPush(p_00,Entry);
        }
        else if (cVar2 == '1') {
          Entry = 1;
          goto LAB_0028857f;
        }
        pbVar1 = (byte *)(pcVar3 + uVar6);
        uVar6 = uVar6 + 1;
      } while (0x19 < (byte)((*pbVar1 & 0xdf) + 0xbf));
    }
    Vec_StrFree(p);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Abc_ManReadBinary( char * pFileName, char * pToken )
{
    Vec_Int_t * vMap = NULL;
    Vec_Str_t * vStr;
    char * pStr;
    int i, Length;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return NULL;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        pStr  += strlen( pToken );
        vMap   = Vec_IntAlloc( 100 );
        Length = strlen( pStr );
        for ( i = 0; i < Length; i++ )
        {
            if ( pStr[i] == '0' || pStr[i] == '?' )
                Vec_IntPush( vMap, 0 );
            else if ( pStr[i] == '1' )
                Vec_IntPush( vMap, 1 );
            if ( ('a' <= pStr[i] && pStr[i] <= 'z') || 
                 ('A' <= pStr[i] && pStr[i] <= 'Z') )
                break;
        }
    }
    Vec_StrFree( vStr );
    return vMap;
}